

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

ags_t AGSSockAPI::AGSEnumerateError(int errnum)

{
  ags_t aStack_10;
  int errnum_local;
  
  switch(errnum) {
  case 0:
    aStack_10 = 0;
    break;
  case 1:
  case 0xd:
    aStack_10 = 2;
    break;
  default:
    aStack_10 = 1;
    break;
  case 4:
  case 0xb:
  case 0x72:
  case 0x73:
    aStack_10 = 4;
    break;
  case 9:
  case 0x58:
    aStack_10 = 5;
    break;
  case 0xc:
  case 0x17:
  case 0x18:
  case 0x69:
    aStack_10 = 10;
    break;
  case 0xe:
  case 0x16:
  case 0x59:
  case 0x5b:
  case 0x6a:
    aStack_10 = 7;
    break;
  case 0x20:
  case 0x6b:
  case 0x6c:
  case 0x6e:
    aStack_10 = 0xc;
    break;
  case 0x47:
  case 0x5d:
  case 0x5e:
  case 0x5f:
    aStack_10 = 8;
    break;
  case 0x61:
  case 0x62:
  case 99:
    aStack_10 = 3;
    break;
  case 100:
  case 0x65:
    aStack_10 = 0xb;
    break;
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6f:
    aStack_10 = 6;
    break;
  case 0x71:
    aStack_10 = 9;
  }
  return aStack_10;
}

Assistant:

ags_t AGSEnumerateError(int errnum)
{
	switch (errnum)
	{
		case 0:
		                          return AGSSOCK_NO_ERROR;
		case ERR(ACCES):
		NOT_WIN(case ERR(PERM):)
		                          return AGSSOCK_ACCESS_DENIED;
		case ERR(ADDRINUSE):
		case ERR(ADDRNOTAVAIL):
		case ERR(AFNOSUPPORT):
		                          return AGSSOCK_ADDRESS_NOT_AVAILABLE;
#ifndef _WIN32
	#if EAGAIN != EWOULDBLOCK
		case EAGAIN:
	#endif
#endif
		case ERR(WOULDBLOCK):
		case ERR(ALREADY):
		case ERR(INPROGRESS):
		case ERR(INTR):
		                          return AGSSOCK_PLEASE_TRY_AGAIN;
		case ERR(BADF):
		case ERR(NOTSOCK):
		                          return AGSSOCK_SOCKET_NOT_VALID;
		case ERR(CONNABORTED):
		case ERR(CONNREFUSED):
		case ERR(CONNRESET):
		case ERR(NETRESET):
		                          return AGSSOCK_DISCONNECTED;
		case ERR(DESTADDRREQ):
		case ERR(INVAL):
		case ERR(PROTOTYPE):
		case ERR(FAULT):
		case ERR(ISCONN):
		                          return AGSSOCK_INVALID;
		case ERR(OPNOTSUPP):
		NOT_WIN(case ERR(PROTO):)
		case ERR(PROTONOSUPPORT):
		case ERR(SOCKTNOSUPPORT):
		                          return AGSSOCK_UNSUPPORTED;
		case ERR(HOSTUNREACH):
		                          return AGSSOCK_HOST_NOT_REACHED;
		case ERR(MFILE):
		NOT_WIN(case ERR(NFILE):)
		case ERR(NOBUFS):
		NOT_WIN(case ERR(NOMEM):)
		                          return AGSSOCK_NOT_ENOUGH_RESOURCES;
		case ERR(NETDOWN):
		case ERR(NETUNREACH):
		                          return AGSSOCK_NETWORK_NOT_AVAILABLE;
		case ERR(NOTCONN):
		NOT_WIN(case ERR(PIPE):)
		case ERR(SHUTDOWN):
		case ERR(TIMEDOUT):
		                          return AGSSOCK_NOT_CONNECTED;
		default:
		                          return AGSSOCK_OTHER_ERROR;
	}
}